

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void __thiscall dlib::logger::logger_stream::print_header_and_stuff(logger_stream *this)

{
  long lVar1;
  bool bVar2;
  print_header_type p_Var3;
  string *psVar4;
  uint64 uVar5;
  global_data *in_RDI;
  unsigned_long in_stack_ffffffffffffffd8;
  rmutex *in_stack_ffffffffffffffe0;
  log_level *plVar6;
  size_type in_stack_ffffffffffffffe8;
  
  if (((in_RDI->m).m.myMutex.__size[0x10] & 1U) == 0) {
    rmutex::lock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    bVar2 = mfp_kernel_1_base_class<4UL>::is_set((mfp_kernel_1_base_class<4UL> *)0x3d8eb9);
    if (bVar2) {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_RDI,in_stack_ffffffffffffffe8);
    }
    else {
      p_Var3 = logger_header_abi_cxx11_(*(logger **)((long)&(in_RDI->m).m.myMutex + 8));
      lVar1 = *(long *)((long)&(in_RDI->m).m.myMutex + 8);
      psVar4 = name_abi_cxx11_(*(logger **)((long)&(in_RDI->m).m.myMutex + 8));
      plVar6 = (log_level *)(in_RDI->m).m.myMutex.__align;
      uVar5 = global_data::get_thread_name(in_RDI);
      (*p_Var3)((ostream *)(lVar1 + 0x40),psVar4,plVar6,uVar5);
    }
    (in_RDI->m).m.myMutex.__size[0x10] = '\x01';
  }
  return;
}

Assistant:

void logger::logger_stream::
    print_header_and_stuff (
    )
    {
        if (!been_used)
        {
            log.gd.m.lock();

            // Check if the output hook is setup.  If it isn't then we print the logger
            // header like normal.  Otherwise we need to remember to clear out the output
            // stringstream we always write to.
            if (log.hook.is_set() == false)
            {
                log.logger_header()(log.out,log.name(),l,log.gd.get_thread_name());
            }
            else
            {
                // Make sure the hook buffer doesn't have any old data in it before we start
                // logging a new message into it.
                log.gd.hookbuf.buffer.resize(0);
            }
            been_used = true;
        }
    }